

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

void __thiscall particleSamples::read_in_particle_samples_and_filter(particleSamples *this)

{
  particleSamples *in_RDI;
  int in_stack_ffffffffffffffec;
  
  read_in_particle_samples(in_RDI);
  filter_particles_from_events(in_RDI,in_stack_ffffffffffffffec);
  return;
}

Assistant:

void particleSamples::read_in_particle_samples_and_filter() {
    read_in_particle_samples();

    filter_particles_from_events(particle_monval);
    // filter_particles_into_lists(full_particle_list);

    //// reconst phi(1020) from K^+ and K^- pair
    // if (reconst_flag == 1)
    //     perform_particle_reconstruction();
}